

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CGUIStaticText.cpp
# Opt level: O0

void __thiscall irr::gui::CGUIStaticText::~CGUIStaticText(CGUIStaticText *this,void **vtt)

{
  undefined8 *in_RSI;
  IGUIStaticText *in_RDI;
  IReferenceCounted *in_stack_ffffffffffffffd8;
  
  (in_RDI->super_IGUIElement).super_IEventReceiver._vptr_IEventReceiver = (_func_int **)*in_RSI;
  *(undefined8 *)
   ((in_RDI->super_IGUIElement).super_IEventReceiver._vptr_IEventReceiver[-3] +
   (long)&(in_RDI->super_IGUIElement).super_IEventReceiver._vptr_IEventReceiver) = in_RSI[5];
  if (in_RDI[1].super_IGUIElement.super_IEventReceiver._vptr_IEventReceiver != (_func_int **)0x0) {
    IReferenceCounted::drop(in_stack_ffffffffffffffd8);
  }
  core::array<irr::core::string<wchar_t>_>::~array((array<irr::core::string<wchar_t>_> *)0x3cc79a);
  IGUIStaticText::~IGUIStaticText(in_RDI,&in_stack_ffffffffffffffd8->_vptr_IReferenceCounted);
  return;
}

Assistant:

CGUIStaticText::~CGUIStaticText()
{
	if (OverrideFont)
		OverrideFont->drop();
}